

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

bool __thiscall cfd::core::Script::IsMultisigScript(Script *this)

{
  ScriptElement *this_00;
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_48;
  
  this_00 = (this->script_stack_).
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (((3 < (ulong)(((long)(this->script_stack_).
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)this_00) / 0x60)) &&
      (bVar5 = ScriptElement::IsNumber(this_00), bVar5)) &&
     (bVar5 = ScriptElement::IsNumber
                        ((this->script_stack_).
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -2), bVar5)) {
    pSVar1 = (this->script_stack_).
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (this->script_stack_).
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)pSVar2 - (long)pSVar1;
    if (pSVar2[-1].op_code_.data_type_ == ScriptOperator::OP_CHECKMULTISIG._8_4_) {
      lVar3 = pSVar1->value_;
      lVar4 = *(long *)((long)pSVar1 + lVar7 + -0x68);
      if (((0x10 < lVar3) || (pSVar1->type_ == kElementOpCode)) &&
         ((0x10 < lVar4 || (*(int *)((long)pSVar1 + lVar7 + -0xb8) == 0)))) {
        if (lVar3 == 0) {
          return false;
        }
        if (lVar4 < lVar3) {
          return false;
        }
        if (lVar4 != lVar7 / 0x60 + -3) {
          return false;
        }
        lVar7 = 0xa0;
        uVar8 = 0;
        while( true ) {
          pSVar1 = (this->script_stack_).
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = uVar8 + 1;
          bVar5 = ((long)(this->script_stack_).
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x60 - 2U <=
                  uVar8;
          if (bVar5) {
            return bVar5;
          }
          if (*(int *)((long)pSVar1 + lVar7 + -0x38) != 1) break;
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_48,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&pSVar1->_vptr_ScriptElement + lVar7));
          bVar6 = Pubkey::IsValid((ByteData *)&_Stack_48);
          lVar7 = lVar7 + 0x60;
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&_Stack_48);
          if (!bVar6) {
            return bVar5;
          }
        }
        return bVar5;
      }
    }
  }
  return false;
}

Assistant:

bool Script::IsMultisigScript() const {
  if (script_stack_.size() < 4 || !script_stack_[0].IsNumber() ||
      !script_stack_[(script_stack_.size() - 2)].IsNumber() ||
      script_stack_[(script_stack_.size() - 1)].GetOpCode() !=
          ScriptOperator::OP_CHECKMULTISIG) {
    return false;
  }
  int64_t req_num = script_stack_[0].GetNumber();
  int64_t num = script_stack_[(script_stack_.size() - 2)].GetNumber();
  if (req_num <= 16 && !script_stack_[0].IsOpCode()) {
    return false;
  }
  if (num <= 16 && !script_stack_[(script_stack_.size() - 2)].IsOpCode()) {
    return false;
  }

  if (req_num > num || req_num == 0 ||
      num != static_cast<int64_t>(script_stack_.size() - 3)) {
    return false;
  }

  for (size_t i = 1; i < (script_stack_.size() - 2); ++i) {
    if (!script_stack_[i].IsBinary() ||
        !Pubkey::IsValid(script_stack_[i].GetBinaryData())) {
      return false;
    }
  }
  return true;
}